

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBoolReader.cpp
# Opt level: O1

void IBoolReader::getBlock(ifstream *ifs,string *str,string *blockName,bool type)

{
  char cVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  cVar3 = (char)str;
  if (blockName->_M_string_length != 0) {
    uVar4 = 0;
    do {
      std::istream::get();
      std::__cxx11::string::push_back(cVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 < blockName->_M_string_length);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  bVar5 = true;
  if (local_48 == blockName->_M_string_length) {
    if (local_48 == 0) {
      bVar5 = false;
    }
    else {
      iVar2 = bcmp(local_50,(blockName->_M_dataplus)._M_p,local_48);
      bVar5 = iVar2 != 0;
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (bVar5) {
LAB_0010acd1:
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    cVar1 = std::istream::get();
    if (cVar1 == -1) {
      bVar5 = false;
    }
    else {
      do {
        std::__cxx11::string::push_back(cVar3);
        bVar5 = IDictionary::isBlankSep(cVar1);
        if (!bVar5) break;
        if (cVar1 == '\n') {
          std::__cxx11::string::push_back(cVar3);
        }
        cVar1 = std::istream::get();
      } while (cVar1 != -1);
      bVar5 = cVar1 == '(';
    }
    if (type) {
      if (!bVar5) goto LAB_0010acd1;
      do {
        iVar2 = std::istream::get();
        if (iVar2 << 0x18 == -0x1000000) break;
        std::__cxx11::string::push_back(cVar3);
      } while (iVar2 << 0x18 != 0x29000000);
      while( true ) {
        cVar1 = std::istream::get();
        bVar5 = IDictionary::isBlankSep(cVar1);
        if (!bVar5) break;
        std::__cxx11::string::push_back(cVar3);
        if (cVar1 == '\n') {
          std::__cxx11::string::push_back(cVar3);
        }
      }
    }
    if (cVar1 == ';') {
      std::__cxx11::string::push_back(cVar3);
    }
    else if (cVar1 == '{') {
      if (type) {
        std::__cxx11::string::push_back(cVar3);
      }
      iVar2 = std::istream::get();
      do {
        iVar2 = iVar2 << 0x18;
        if (iVar2 == -0x1000000) {
          return;
        }
        std::__cxx11::string::push_back(cVar3);
        if (iVar2 == 0x7d000000) {
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (iVar2 == 0xa000000) {
            std::__cxx11::string::push_back(cVar3);
          }
        }
        iVar2 = std::istream::get();
      } while (bVar5);
    }
    else {
      do {
        std::__cxx11::string::push_back(cVar3);
        cVar1 = std::istream::get();
      } while (cVar1 != ';');
    }
  }
  return;
}

Assistant:

void IBoolReader::getBlock(std::ifstream* ifs,std::string &str, const std::string &blockName, bool type) {
    char tempChar;
    int num_3l;
    int base_len = str.length();

    for(int i=0;i<blockName.length();i++)
    {
        tempChar=ifs->get();
        str+=tempChar;
    }
    if(str.substr(str.length()-blockName.length(),blockName.length())!=blockName) {
        str = str.substr(0,base_len);
        return;
    }

    while((tempChar=ifs->get())!=EOF)
    {
        str+=tempChar;
        if(!IDictionary::isBlankSep(tempChar))
            break;
        if(tempChar=='\n')
            str+='\n';
    }

    if(type)
    {
        if (tempChar != '(') {
            str = str.substr(0, base_len);
            return;
        }
        while ((tempChar = ifs->get()) != EOF) {
            str += tempChar;
            if (tempChar == ')')
                break;
        }
        while (true) {
            tempChar = ifs->get();
            if (IDictionary::isBlankSep(tempChar)) {
                str += tempChar;
                if (tempChar == '\n')
                    str += '\n';
            } else
                break;
        }
    }

    if(tempChar=='{')
    {
        if(type)
            str+=tempChar;
        num_3l=1;

        while ((tempChar=ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=ifs->get();
        }while (tempChar!=';');
    }
}